

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void curses_update_status(nh_player_info *pi)

{
  char *pcVar1;
  nh_bool nVar2;
  int val_max;
  wchar_t wVar3;
  attr_t aVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  long in_RCX;
  ulong uVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  long oldv;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  nh_bool nVar14;
  dgn_name_value dVar15;
  nh_player_info *pnVar16;
  char *pcVar17;
  WINDOW *pWVar18;
  attr_t local_90;
  wchar_t stat_ch_col;
  char buf [80];
  
  curses_update_status_silent(pi);
  iVar9 = player.max_rank_sz;
  nVar2 = ui_flags.status3;
  if (player.x == 0) {
    return;
  }
  if (settings.classic_status != '\0') {
    sVar5 = strlen(player.plname);
    sprintf(buf,"%.10s the %-*s  ",&player,(ulong)((iVar9 - (int)sVar5) + 8),0x1319ac);
    pp_Var6 = __ctype_toupper_loc();
    buf[0] = (char)(*pp_Var6)[(byte)buf[0]];
    wmove(statuswin,0,0);
    val_max = player.hpmax;
    iVar9 = player.hp;
    sVar5 = strlen(buf);
    uVar13 = (uint)sVar5;
    uVar7 = sVar5 & 0xffffffff;
    uVar11 = uVar13 + 1;
    do {
      uVar12 = (int)uVar13 >> 0x1f & uVar13;
      if ((int)uVar7 < 1) break;
      uVar11 = uVar11 - 1;
      lVar8 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      uVar12 = uVar11;
    } while (buf[lVar8] == ' ');
    uVar13 = 0;
    if (0 < iVar9 && 0 < val_max) {
      uVar13 = (int)(uVar12 * iVar9) / val_max;
    }
    if ((int)uVar12 <= (int)uVar13) {
      uVar13 = uVar12;
    }
    wVar3 = percent_color(iVar9,val_max,'\x01');
    aVar4 = curses_color_attr(wVar3,0);
    waddch(statuswin,0x5b);
    wattr_on(statuswin,aVar4,0);
    wattr_on(statuswin,0x40000,0);
    wprintw(statuswin,"%.*s",uVar13,buf);
    wattr_off(statuswin,0x40000,0);
    wprintw(statuswin,"%.*s",uVar12 - uVar13,buf + (int)uVar13);
    wattr_off(statuswin,aVar4,0);
    waddch(statuswin,0x5d);
    waddnstr(statuswin," ",0xffffffff);
    status_change_color_on
              (&stat_ch_col,&local_90,(long)old_player.st,(long)old_player.st_extra,(long)player.st,
               (long)player.st_extra);
    waddnstr(statuswin,"St:",0xffffffff);
    if ((player.st == 0x12) && (player.st_extra != 0)) {
      if (player.st_extra < 100) {
        wprintw(statuswin,"18/%02d",player.st_extra);
      }
      else {
        wprintw(statuswin,"18/**");
      }
    }
    else {
      wprintw(statuswin,"%-1d");
    }
    status_change_color_off(stat_ch_col,local_90);
    print_statdiff(" ","Dx:%-1d",(long)old_player.dx,(long)player.dx);
    print_statdiff(" ","Co:%-1d",(long)old_player.co,(long)player.co);
    print_statdiff(" ","In:%-1d",(long)old_player.in,(long)player.in);
    print_statdiff(" ","Wi:%-1d",(long)old_player.wi,(long)player.wi);
    print_statdiff(" ","Ch:%-1d",(long)old_player.ch,(long)player.ch);
    pcVar10 = " Lawful";
    if (player.align == 0) {
      pcVar10 = " Neutral";
    }
    pcVar17 = " Chaotic";
    if (player.align != -1) {
      pcVar17 = pcVar10;
    }
    wprintw(statuswin,pcVar17);
    if (settings.showscore != '\0') {
      print_statdiff(" ","S:%ld",(long)old_player.score,(long)player.score);
    }
    wclrtoeol(statuswin);
    dVar15 = DGN_NAME_SHORT;
    wmove(statuswin,1,0);
    draw_dungeon_name((nh_player_info *)0x0,dVar15);
    waddnstr(statuswin," ",0xffffffff);
    status_change_color_on(&stat_ch_col,&local_90,(long)old_player.gold,0,(long)player.gold,0);
    wprintw(statuswin,"%c:%-2ld",(int)player.coinsym,player.gold);
    status_change_color_off(stat_ch_col,local_90);
    waddnstr(statuswin," HP:",0xffffffff);
    if (player.hp * 7 < player.hpmax) {
      wattr_on(statuswin,0x40000,0);
    }
    wVar3 = percent_color(player.hp,player.hpmax,'\x01');
    aVar4 = curses_color_attr(wVar3,0);
    wattr_on(statuswin,aVar4,0);
    wprintw(statuswin,"%d(%d)",player.hp,player.hpmax);
    wattr_off(statuswin,aVar4,0);
    if (player.hp * 7 < player.hpmax) {
      wattr_off(statuswin,0x40000,0);
    }
    waddnstr(statuswin," Pw:",0xffffffffffffffff);
    wVar3 = percent_color(player.en,player.enmax,'\0');
    aVar4 = curses_color_attr(wVar3,0);
    wattr_on(statuswin,aVar4,0);
    uVar7 = (ulong)(uint)player.enmax;
    wprintw(statuswin,"%d(%d)",player.en);
    wattr_off(statuswin,aVar4,0);
    print_statdiffr("AC:%-2d",(char *)(long)old_player.ac,(long)player.ac,uVar7);
    if (player.monnum == player.cur_monnum) {
      oldv = (long)old_player.level;
      lVar8 = (long)player.level;
      pcVar17 = " ";
      if (settings.showexp == '\0') {
        pcVar10 = "Exp:%u";
      }
      else {
        print_statdiff(" ","Xp:%u",oldv,lVar8);
        oldv = (long)old_player.xp;
        lVar8 = (long)player.xp;
        pcVar17 = "/";
        pcVar10 = "%-1ld";
      }
    }
    else {
      oldv = (long)old_player.level;
      lVar8 = (long)player.level;
      pcVar17 = " ";
      pcVar10 = "HD:%d";
    }
    print_statdiff(pcVar17,pcVar10,oldv,lVar8);
    nVar14 = 'Z';
    pnVar16 = (nh_player_info *)statuswin;
    waddnstr(statuswin," ",0xffffffffffffffff);
    draw_time(pnVar16);
    wclrtoeol(statuswin);
    if (nVar2 != '\0') {
      nVar14 = '\x02';
      wmove(statuswin,2,0);
      wclrtoeol(statuswin);
    }
    draw_statuses((nh_player_info *)(ulong)(uint)(int)nVar2,nVar14);
    goto LAB_00116686;
  }
  wmove(statuswin,ui_flags.status3 != '\0',0);
  draw_bar(player.hp,player.hpmax,L'\x01',(nh_bool)in_RCX);
  print_statdiffr("AC:%d",(char *)(long)old_player.ac,(long)player.ac,in_RCX);
  lVar8 = (long)player.level;
  pcVar10 = "HD:%d";
  if (player.monnum == player.cur_monnum) {
    pcVar10 = "Xp:%d";
  }
  print_statdiff(" ",pcVar10,(long)old_player.level,lVar8);
  nVar14 = (nh_bool)lVar8;
  if (((nVar2 != '\0') && (settings.showexp != '\0')) && (player.monnum == player.cur_monnum)) {
    waddnstr(statuswin,"(",0xffffffff);
    lVar8 = (long)old_player.xp;
    status_change_color_on
              (&stat_ch_col,&local_90,(long)old_player.level,lVar8,(long)player.level,
               (long)player.xp);
    nVar14 = (nh_bool)lVar8;
    wprintw(statuswin,"%ld",player.xp_next - player.xp);
    status_change_color_off(stat_ch_col,local_90);
    waddnstr(statuswin,")",0xffffffff);
  }
  pcVar10 = " ";
  dVar15 = 0x11905a;
  waddnstr(statuswin," ",0xffffffff);
  uVar13 = 2 - (nVar2 == '\0');
  draw_dungeon_name((nh_player_info *)(ulong)uVar13,dVar15);
  wclrtoeol(statuswin);
  wmove(statuswin,uVar13,0);
  draw_bar(player.en,player.enmax,L'\0',nVar14);
  waddnstr(statuswin," ",0xffffffff);
  status_change_color_on(&stat_ch_col,&local_90,(long)old_player.gold,0,(long)player.gold,0);
  wprintw(statuswin,"%c%ld",(int)player.coinsym,player.gold);
  nVar14 = (nh_bool)local_90;
  status_change_color_off(stat_ch_col,local_90);
  if (settings.showscore != '\0') {
    nVar14 = '\x03';
    print_statdiff(" ","S:%ld",(long)old_player.score,(long)player.score);
  }
  if (settings.time != '\0') {
    nVar14 = 'Z';
    pnVar16 = (nh_player_info *)statuswin;
    waddnstr(statuswin," ",0xffffffffffffffff);
    draw_time(pnVar16);
  }
  wclrtoeol(statuswin);
  draw_statuses((nh_player_info *)(ulong)(uint)(int)nVar2,nVar14);
  if (nVar2 == '\0') {
    sprintf(buf,"%.12s, %s",&player,0x1319ac);
    pWVar18 = statuswin;
    if (statuswin == (WINDOW *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = statuswin->_maxx + 1;
    }
    sVar5 = strlen(buf);
    iVar9 = iVar9 - (int)sVar5;
  }
  else {
    pcVar17 = " Lawful";
    if (player.align == 0) {
      pcVar17 = " Neutral";
    }
    pcVar1 = " Chaotic";
    if (player.align != -1) {
      pcVar1 = pcVar17;
    }
    pcVar17 = (char *)0x13199c;
    if (player.monnum != player.cur_monnum) {
      pcVar17 = "";
      pcVar10 = "";
    }
    sprintf(buf,"%.12s the %s %s%s%s",&player,pcVar1 + 1,pcVar17,pcVar10,0x1319ac);
    iVar9 = 0;
    pWVar18 = statuswin;
  }
  wmove(pWVar18,0,iVar9);
  wprintw(statuswin,"%s",buf);
  wclrtoeol(statuswin);
  if (nVar2 == '\0') goto LAB_00116686;
  status_change_color_on
            (&stat_ch_col,&local_90,(long)old_player.st,(long)old_player.st_extra,(long)player.st,
             (long)player.st_extra);
  if ((player.st == 0x12) && (player.st_extra != 0)) {
    if (statuswin == (WINDOW *)0x0) {
      uVar7 = 0xffffffffffffffeb;
    }
    else {
      uVar7 = (ulong)((int)statuswin->_maxx - 0x13);
    }
    wmove(statuswin,0,uVar7);
    if (player.st_extra != 100) {
      pcVar10 = "St:18/%02d";
      iVar9 = player.st_extra;
      goto LAB_0011657c;
    }
    waddnstr(statuswin,"St:18/**",0xffffffffffffffff);
  }
  else {
    if (statuswin == (WINDOW *)0x0) {
      uVar7 = 0xffffffffffffffee;
    }
    else {
      uVar7 = (ulong)((int)statuswin->_maxx - 0x10);
    }
    wmove(statuswin,0,uVar7);
    pcVar10 = "St:%-2d";
    iVar9 = player.st;
LAB_0011657c:
    wprintw(statuswin,pcVar10,iVar9);
  }
  status_change_color_off(stat_ch_col,local_90);
  print_statdiff(" ","Dx:%-2d",(long)old_player.dx,(long)player.dx);
  print_statdiff(" ","Co:%-2d",(long)old_player.co,(long)player.co);
  uVar13 = (uint)(player.st_extra == 0 || player.st != 0x12);
  if (statuswin == (WINDOW *)0x0) {
    iVar9 = uVar13 * 3 + -0x15;
  }
  else {
    iVar9 = (int)statuswin->_maxx + uVar13 * 3 + -0x13;
  }
  wmove(statuswin,1,iVar9);
  print_statdiff((char *)0x0,"In:%-2d",(long)old_player.in,(long)player.in);
  if (statuswin == (WINDOW *)0x0) {
    uVar7 = 0xfffffffffffffff4;
  }
  else {
    uVar7 = (ulong)((int)statuswin->_maxx - 10);
  }
  wmove(statuswin,1,uVar7);
  print_statdiff((char *)0x0,"Wi:%-2d",(long)old_player.wi,(long)player.wi);
  print_statdiff(" ","Ch:%-2d",(long)old_player.ch,(long)player.ch);
LAB_00116686:
  wmove(mapwin,player.y,player.x + -1);
  if ((ui_flags.draw_frame != '\0') && (settings.frame_hp_color != '\0')) {
    redraw_frame();
  }
  wnoutrefresh(statuswin);
  return;
}

Assistant:

void curses_update_status(struct nh_player_info *pi)
{
    curses_update_status_silent(pi);

    if (player.x == 0)
	return; /* called before the game is running */

    if (settings.classic_status)
	classic_status(&player, ui_flags.status3);
    else
	draw_status_lines(&player, ui_flags.status3);

    /* prevent the cursor from flickering in the status line */
    wmove(mapwin, player.y, player.x - 1);

    /* if HP changes, frame color may change */
    if (ui_flags.draw_frame && settings.frame_hp_color)
	redraw_frame();

    wnoutrefresh(statuswin);
}